

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  bool bVar5;
  U32 UVar6;
  int iVar7;
  uint uVar8;
  ZSTD_nextInputType_e ZVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  size_t sVar15;
  void *pvVar16;
  size_t sVar17;
  long *in_RDX;
  long *in_RSI;
  ZSTD_DStream *in_RDI;
  size_t nextSrcSizeHint;
  size_t flushedSize;
  size_t toFlushSize;
  size_t decodedSize_1;
  size_t loadedSize;
  int isSkipFrame_1;
  size_t toLoad_1;
  size_t neededInSize_1;
  size_t decodedSize;
  int isSkipFrame;
  size_t neededInSize;
  size_t bufferSize;
  size_t neededOutBuffSize;
  size_t neededInBuffSize;
  size_t errcod_1;
  size_t errcod;
  size_t decompressedSize;
  size_t cSize;
  size_t remainingInput;
  size_t toLoad;
  size_t hSize;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *ip;
  char *iend;
  char *istart;
  ZSTD_allocFunction in_stack_fffffffffffffea8;
  ZSTD_DDict *in_stack_fffffffffffffeb0;
  ZSTD_DCtx *in_stack_fffffffffffffeb8;
  void *in_stack_fffffffffffffec0;
  void *in_stack_fffffffffffffec8;
  ZSTD_DStream *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  unsigned_long_long in_stack_fffffffffffffee8;
  void *in_stack_fffffffffffffef0;
  void *in_stack_ffffffffffffff00;
  ZSTD_DCtx *in_stack_ffffffffffffff08;
  ZSTD_DCtx *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  long local_50;
  void *local_38;
  size_t local_8;
  
  pvVar10 = (void *)(*in_RDX + in_RDX[2]);
  pvVar11 = (void *)(*in_RDX + in_RDX[1]);
  lVar1 = *in_RSI;
  lVar2 = in_RSI[2];
  lVar3 = *in_RSI;
  lVar4 = in_RSI[1];
  bVar5 = true;
  if ((ulong)in_RDX[1] < (ulong)in_RDX[2]) {
    local_8 = 0xffffffffffffffb8;
  }
  else {
    local_50 = lVar1 + lVar2;
    local_38 = pvVar10;
    if ((ulong)in_RSI[1] < (ulong)in_RSI[2]) {
      local_8 = 0xffffffffffffffba;
    }
    else {
LAB_0020212e:
      if (bVar5) {
        uVar12 = (ulong)in_RDI->streamStage;
        switch(uVar12) {
        case 0:
          goto switchD_0020216c_caseD_0;
        case 1:
          goto switchD_0020216c_caseD_1;
        case 2:
          goto switchD_0020216c_caseD_2;
        case 3:
          goto switchD_0020216c_caseD_3;
        case 4:
          goto switchD_0020216c_caseD_4;
        default:
          return 0xffffffffffffffff;
        }
      }
      in_RDX[2] = (long)local_38 + (in_RDX[2] - (long)pvVar10);
      in_RSI[2] = (local_50 - (lVar1 + lVar2)) + in_RSI[2];
      sVar17 = ZSTD_nextSrcSizeToDecompress(in_RDI);
      if (sVar17 == 0) {
        if (in_RDI->outEnd == in_RDI->outStart) {
          if (in_RDI->hostageByte != 0) {
            if ((ulong)in_RDX[1] <= (ulong)in_RDX[2]) {
              in_RDI->streamStage = zdss_read;
              return 1;
            }
            in_RDX[2] = in_RDX[2] + 1;
          }
          local_8 = 0;
        }
        else {
          if (in_RDI->hostageByte == 0) {
            in_RDX[2] = in_RDX[2] + -1;
            in_RDI->hostageByte = 1;
          }
          local_8 = 1;
        }
      }
      else {
        ZVar9 = ZSTD_nextInputType(in_RDI);
        local_8 = ((long)(int)(uint)(ZVar9 == ZSTDnit_block) * 3 + sVar17) - in_RDI->inPos;
      }
    }
  }
  return local_8;
switchD_0020216c_caseD_0:
  ZSTD_resetDStream(in_RDI);
switchD_0020216c_caseD_1:
  sVar17 = ZSTD_getFrameHeader_advanced
                     ((ZSTD_frameHeader *)
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                      (ZSTD_format_e)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  uVar8 = ERR_isError(sVar17);
  if (uVar8 != 0) {
    return sVar17;
  }
  if (sVar17 == 0) {
    if (((((in_RDI->fParams).frameContentSize == 0) || ((in_RDI->fParams).windowSize == 0)) ||
        ((ulong)((lVar3 + lVar4) - local_50) < (in_RDI->fParams).frameContentSize)) ||
       (sVar17 = ZSTD_findFrameCompressedSize
                           (in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00),
       (ulong)((long)pvVar11 - (long)pvVar10) < sVar17)) {
      sVar17 = ZSTD_decompressBegin_usingDDict(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      uVar8 = ERR_isError(sVar17);
      if (uVar8 != 0) {
        return sVar17;
      }
      UVar6 = MEM_readLE32(in_stack_fffffffffffffea8);
      if ((UVar6 & 0xfffffff0) == 0x184d2a50) {
        UVar6 = MEM_readLE32(in_stack_fffffffffffffea8);
        in_RDI->expected = (ulong)UVar6;
        in_RDI->stage = ZSTDds_skipFrame;
      }
      else {
        sVar17 = ZSTD_decodeFrameHeader
                           (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                            (size_t)in_stack_fffffffffffffea8);
        uVar8 = ERR_isError(sVar17);
        if (uVar8 != 0) {
          return sVar17;
        }
        in_RDI->expected = 3;
        in_RDI->stage = ZSTDds_decodeBlockHeader;
      }
      if ((in_RDI->fParams).windowSize < 0x401) {
        in_stack_fffffffffffffee8 = 0x400;
      }
      else {
        in_stack_fffffffffffffee8 = (in_RDI->fParams).windowSize;
      }
      (in_RDI->fParams).windowSize = in_stack_fffffffffffffee8;
      if (in_RDI->maxWindowSize < (in_RDI->fParams).windowSize) {
        return 0xfffffffffffffff0;
      }
      if ((in_RDI->fParams).blockSizeMax < 5) {
        in_stack_fffffffffffffee4 = 4;
      }
      else {
        in_stack_fffffffffffffee4 = (in_RDI->fParams).blockSizeMax;
      }
      uVar13 = (ulong)in_stack_fffffffffffffee4;
      sVar17 = ZSTD_decodingBufferSize_min
                         ((in_RDI->fParams).windowSize,(in_RDI->fParams).frameContentSize);
      if ((in_RDI->inBuffSize < uVar13) || (in_RDI->outBuffSize < sVar17)) {
        if (in_RDI->staticSize == 0) {
          customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffec8;
          customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffec0;
          customMem.opaque = in_stack_fffffffffffffed0;
          ZSTD_free((in_RDI->customMem).customFree,customMem);
          in_RDI->inBuffSize = 0;
          in_RDI->outBuffSize = 0;
          in_stack_fffffffffffffea8 = (in_RDI->customMem).customAlloc;
          in_stack_fffffffffffffeb0 = (ZSTD_DDict *)(in_RDI->customMem).customFree;
          in_stack_fffffffffffffeb8 = (ZSTD_DCtx *)(in_RDI->customMem).opaque;
          customMem_00.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffec8;
          customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffec0;
          customMem_00.opaque = in_stack_fffffffffffffed0;
          pcVar14 = (char *)ZSTD_malloc((size_t)in_stack_fffffffffffffea8,customMem_00);
          in_RDI->inBuff = pcVar14;
          if (in_RDI->inBuff == (char *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        else if (in_RDI->staticSize - 0x271e8 < uVar13 + sVar17) {
          return 0xffffffffffffffc0;
        }
        in_RDI->inBuffSize = uVar13;
        in_RDI->outBuff = in_RDI->inBuff + in_RDI->inBuffSize;
        in_RDI->outBuffSize = sVar17;
      }
      in_RDI->streamStage = zdss_read;
switchD_0020216c_caseD_2:
      sVar17 = ZSTD_nextSrcSizeToDecompress(in_RDI);
      if (sVar17 == 0) {
        in_RDI->streamStage = zdss_init;
        bVar5 = false;
      }
      else if ((ulong)((long)pvVar11 - (long)local_38) < sVar17) {
        if (local_38 == pvVar11) {
          bVar5 = false;
        }
        else {
          in_RDI->streamStage = zdss_load;
switchD_0020216c_caseD_3:
          sVar17 = ZSTD_nextSrcSizeToDecompress(in_RDI);
          pvVar16 = (void *)(sVar17 - in_RDI->inPos);
          in_stack_ffffffffffffff2c = ZSTD_isSkipFrame(in_RDI);
          if (in_stack_ffffffffffffff2c == 0) {
            if ((void *)(in_RDI->inBuffSize - in_RDI->inPos) < pvVar16) {
              return 0xffffffffffffffec;
            }
            in_stack_ffffffffffffff20 =
                 (void *)ZSTD_limitCopy(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,
                                        in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8)
            ;
          }
          else {
            in_stack_fffffffffffffec0 = pvVar16;
            in_stack_ffffffffffffff20 = pvVar16;
            if ((void *)((long)pvVar11 - (long)local_38) <= pvVar16) {
              in_stack_fffffffffffffec0 = (void *)((long)pvVar11 - (long)local_38);
              in_stack_ffffffffffffff20 = (void *)((long)pvVar11 - (long)local_38);
            }
          }
          local_38 = (void *)((long)in_stack_ffffffffffffff20 + (long)local_38);
          in_RDI->inPos = (long)in_stack_ffffffffffffff20 + in_RDI->inPos;
          if (in_stack_ffffffffffffff20 < pvVar16) {
            bVar5 = false;
          }
          else {
            in_stack_ffffffffffffff18 =
                 ZSTD_decompressContinue
                           (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,uVar12,
                            in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
            uVar8 = ERR_isError(in_stack_ffffffffffffff18);
            if (uVar8 != 0) {
              return in_stack_ffffffffffffff18;
            }
            in_RDI->inPos = 0;
            if ((in_stack_ffffffffffffff18 == 0) && (in_stack_ffffffffffffff2c == 0)) {
              in_RDI->streamStage = zdss_read;
            }
            else {
              in_RDI->outEnd = in_RDI->outStart + in_stack_ffffffffffffff18;
              in_RDI->streamStage = zdss_flush;
switchD_0020216c_caseD_4:
              in_stack_ffffffffffffff10 = (ZSTD_DCtx *)(in_RDI->outEnd - in_RDI->outStart);
              in_stack_ffffffffffffff08 =
                   (ZSTD_DCtx *)
                   ZSTD_limitCopy(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8,
                                  in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
              local_50 = (long)((in_stack_ffffffffffffff08->entropy).LLTable + -4) + local_50;
              in_RDI->outStart =
                   (long)((in_stack_ffffffffffffff08->entropy).LLTable + -4) + in_RDI->outStart;
              if (in_stack_ffffffffffffff08 == in_stack_ffffffffffffff10) {
                in_RDI->streamStage = zdss_read;
                if ((in_RDI->outBuffSize < (in_RDI->fParams).frameContentSize) &&
                   (in_RDI->outBuffSize < in_RDI->outStart + (ulong)(in_RDI->fParams).blockSizeMax))
                {
                  in_RDI->outEnd = 0;
                  in_RDI->outStart = 0;
                }
              }
              else {
                bVar5 = false;
              }
            }
          }
        }
      }
      else {
        iVar7 = ZSTD_isSkipFrame(in_RDI);
        in_stack_fffffffffffffed8 = in_RDI->outBuff + in_RDI->outStart;
        if (iVar7 == 0) {
          in_stack_fffffffffffffec8 = (void *)(in_RDI->outBuffSize - in_RDI->outStart);
        }
        else {
          in_stack_fffffffffffffec8 = (void *)0x0;
        }
        in_stack_fffffffffffffed0 = in_RDI;
        sVar15 = ZSTD_decompressContinue
                           (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,uVar12,
                            in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        uVar8 = ERR_isError(sVar15);
        if (uVar8 != 0) {
          return sVar15;
        }
        local_38 = (void *)(sVar17 + (long)local_38);
        if ((sVar15 != 0) || (iVar7 != 0)) {
          in_RDI->outEnd = in_RDI->outStart + sVar15;
          in_RDI->streamStage = zdss_flush;
        }
      }
    }
    else {
      sVar15 = ZSTD_decompress_usingDDict
                         ((ZSTD_DCtx *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                          ,in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0,
                          (ZSTD_DDict *)in_stack_fffffffffffffeb8);
      uVar8 = ERR_isError(sVar15);
      if (uVar8 != 0) {
        return sVar15;
      }
      local_38 = (void *)((long)pvVar10 + sVar17);
      local_50 = sVar15 + local_50;
      in_RDI->expected = 0;
      in_RDI->streamStage = zdss_init;
      bVar5 = false;
    }
  }
  else {
    uVar12 = sVar17 - in_RDI->lhSize;
    uVar13 = (long)pvVar11 - (long)local_38;
    if (uVar13 < uVar12) {
      if (uVar13 != 0) {
        memcpy(in_RDI->headerBuffer + in_RDI->lhSize,local_38,uVar13);
        in_RDI->lhSize = uVar13 + in_RDI->lhSize;
      }
      in_RDX[2] = in_RDX[1];
      if (sVar17 < 6) {
        sVar17 = 6;
      }
      return (sVar17 - in_RDI->lhSize) + 3;
    }
    memcpy(in_RDI->headerBuffer + in_RDI->lhSize,local_38,uVar12);
    in_RDI->lhSize = sVar17;
    local_38 = (void *)(uVar12 + (long)local_38);
  }
  goto LAB_0020212e;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const istart = (const char*)(input->src) + input->pos;
    const char* const iend = (const char*)(input->src) + input->size;
    const char* ip = istart;
    char* const ostart = (char*)(output->dst) + output->pos;
    char* const oend = (char*)(output->dst) + output->size;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    if (input->pos > input->size) {  /* forbidden */
        DEBUGLOG(5, "in: pos: %u   vs size: %u",
                    (U32)input->pos, (U32)input->size);
        return ERROR(srcSize_wrong);
    }
    if (output->pos > output->size) {  /* forbidden */
        DEBUGLOG(5, "out: pos: %u   vs size: %u",
                    (U32)output->pos, (U32)output->size);
        return ERROR(dstSize_tooSmall);
    }
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            ZSTD_resetDStream(zds);   /* transparent reset on starting decoding a new frame */
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                /* legacy support is incompatible with static dctx */
                if (zds->staticSize) return ERROR(memory_allocation);
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        const void* const dict = zds->ddict ? zds->ddict->dictContent : NULL;
                        size_t const dictSize = zds->ddict ? zds->ddict->dictSize : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        /* legacy support is incompatible with static dctx */
                        if (zds->staticSize) return ERROR(memory_allocation);
                        CHECK_F(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX(ZSTD_frameHeaderSize_min, hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, zds->ddict);
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            CHECK_F(ZSTD_decompressBegin_usingDDict(zds, zds->ddict));

            if ((MEM_readLE32(zds->headerBuffer) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_frameIdSize);
                zds->stage = ZSTDds_skipFrame;
            } else {
                CHECK_F(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            if (zds->fParams.windowSize > zds->maxWindowSize) return ERROR(frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);
                if ((zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize)) {
                    size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                    DEBUGLOG(4, "inBuff  : from %u to %u",
                                (U32)zds->inBuffSize, (U32)neededInBuffSize);
                    DEBUGLOG(4, "outBuff : from %u to %u",
                                (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                    if (zds->staticSize) {  /* static DCtx */
                        DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                        assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                        if (bufferSize > zds->staticSize - sizeof(ZSTD_DCtx))
                            return ERROR(memory_allocation);
                    } else {
                        ZSTD_free(zds->inBuff, zds->customMem);
                        zds->inBuffSize = 0;
                        zds->outBuffSize = 0;
                        zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                        if (zds->inBuff == NULL) return ERROR(memory_allocation);
                    }
                    zds->inBuffSize = neededInBuffSize;
                    zds->outBuff = zds->inBuff + zds->inBuffSize;
                    zds->outBuffSize = neededOutBuffSize;
            }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    if (toLoad > zds->inBuffSize - zds->inPos) return ERROR(corruption_detected);   /* should never happen */
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default: return ERROR(GENERIC);   /* impossible */
    }   }

    /* result */
    input->pos += (size_t)(ip-istart);
    output->pos += (size_t)(op-ostart);
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}